

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTestCaseBase.cpp
# Opt level: O1

void __thiscall
glcts::TestCaseBase::TestCaseBase
          (TestCaseBase *this,Context *context,ExtParameters *extParam,char *name,char *description)

{
  _Rb_tree_header *p_Var1;
  int local_1c;
  
  tcu::TestCase::TestCase(&this->super_TestCase,context->m_testCtx,name,description);
  (this->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCaseBase_0214a758;
  this->m_context = context;
  this->m_glslVersion = extParam->glslVersion;
  this->m_extType = extParam->extType;
  p_Var1 = &(this->m_specializationMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_specializationMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_specializationMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_specializationMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_specializationMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_specializationMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_is_framebuffer_no_attachments_supported = false;
  this->m_is_geometry_shader_extension_supported = false;
  this->m_is_geometry_shader_point_size_supported = false;
  this->m_is_gpu_shader5_supported = false;
  this->m_is_program_interface_query_supported = false;
  this->m_is_shader_image_load_store_supported = false;
  this->m_is_shader_image_atomic_supported = false;
  this->m_is_texture_storage_multisample_supported = false;
  this->m_is_texture_storage_multisample_supported = false;
  this->m_is_texture_storage_multisample_2d_array_supported = false;
  this->m_is_tessellation_shader_supported = false;
  this->m_is_tessellation_shader_point_size_supported = false;
  this->m_is_texture_cube_map_array_supported = false;
  this->m_is_texture_border_clamp_supported = false;
  this->m_is_texture_buffer_supported = false;
  this->m_is_viewport_array_supported = false;
  this->seed_value = 1;
  local_1c = (*context->m_renderCtx->_vptr_RenderContext[2])();
  deqp::GLExtTokens::init(&this->m_glExtTokens,(EVP_PKEY_CTX *)&local_1c);
  return;
}

Assistant:

TestCaseBase::TestCaseBase(Context& context, const ExtParameters& extParam, const char* name, const char* description)
	: tcu::TestCase(context.getTestContext(), name, description)
	, m_context(context)
	, m_glslVersion(extParam.glslVersion)
	, m_extType(extParam.extType)
	, m_is_framebuffer_no_attachments_supported(false)
	, m_is_geometry_shader_extension_supported(false)
	, m_is_geometry_shader_point_size_supported(false)
	, m_is_gpu_shader5_supported(false)
	, m_is_program_interface_query_supported(false)
	, m_is_shader_image_load_store_supported(false)
	, m_is_shader_image_atomic_supported(false)
	, m_is_texture_storage_multisample_supported(false)
	, m_is_texture_storage_multisample_2d_array_supported(false)
	, m_is_tessellation_shader_supported(false)
	, m_is_tessellation_shader_point_size_supported(false)
	, m_is_texture_cube_map_array_supported(false)
	, m_is_texture_border_clamp_supported(false)
	, m_is_texture_buffer_supported(false)
	, m_is_viewport_array_supported(false)
	, seed_value(1)
{
	m_glExtTokens.init(context.getRenderContext().getType());
}